

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t FASTCOVER_ctx_init(FASTCOVER_ctx_t *ctx,void *samplesBuffer,size_t *samplesSizes,
                         uint nbSamples,uint d,double splitPoint,uint f,
                         FASTCOVER_accel_t accelParams)

{
  uint nbSamples_00;
  uint nbSamples_01;
  FASTCOVER_ctx_t *pFVar1;
  FASTCOVER_ctx_t *pFVar2;
  void *pvVar3;
  uint in_ECX;
  size_t *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  uint in_R8D;
  undefined4 in_R9D;
  double in_XMM0_Qa;
  undefined8 in_stack_00000008;
  U32 i;
  size_t testSamplesSize;
  size_t trainingSamplesSize;
  uint nbTestSamples;
  uint nbTrainSamples;
  size_t totalSamplesSize;
  BYTE *samples;
  ulong local_a0;
  FASTCOVER_ctx_t *local_90;
  FASTCOVER_ctx_t *local_80;
  FASTCOVER_ctx_t *ctx_00;
  undefined4 in_stack_ffffffffffffff90;
  uint uVar4;
  uint local_64;
  size_t local_8;
  
  pFVar1 = (FASTCOVER_ctx_t *)COVER_sum(in_RDX,in_ECX);
  local_80 = pFVar1;
  ctx_00 = pFVar1;
  uVar4 = in_ECX;
  nbSamples_01 = in_ECX;
  nbSamples_00 = in_ECX;
  pFVar2 = pFVar1;
  if (in_XMM0_Qa < 1.0) {
    nbSamples_00 = (uint)(long)((double)in_ECX * in_XMM0_Qa);
    nbSamples_01 = in_ECX - nbSamples_00;
    uVar4 = nbSamples_01;
    pFVar2 = (FASTCOVER_ctx_t *)COVER_sum(in_RDX,nbSamples_00);
    ctx_00 = pFVar2;
    local_80 = (FASTCOVER_ctx_t *)
               COVER_sum(in_RDX + ((long)((double)in_ECX * in_XMM0_Qa) & 0xffffffff),nbSamples_01);
  }
  if (in_R8D < 9) {
    local_90 = (FASTCOVER_ctx_t *)0x8;
  }
  else {
    local_90 = (FASTCOVER_ctx_t *)(ulong)in_R8D;
  }
  if ((pFVar1 < local_90) || ((FASTCOVER_ctx_t *)0xfffffffe < pFVar1)) {
    if (0 < g_displayLevel) {
      fprintf(_stderr,"Total samples size is too large (%u MB), maximum size is %u MB\n",
              (ulong)pFVar1 >> 0x14 & 0xffffffff,0xfff);
      fflush(_stderr);
    }
    local_8 = 0xffffffffffffffb8;
  }
  else if (nbSamples_00 < 5) {
    if (0 < g_displayLevel) {
      fprintf(_stderr,"Total number of training samples is %u and is invalid\n",(ulong)nbSamples_00)
      ;
      fflush(_stderr);
    }
    local_8 = 0xffffffffffffffb8;
  }
  else if (nbSamples_01 == 0) {
    if (0 < g_displayLevel) {
      fprintf(_stderr,"Total number of testing samples is %u and is invalid.\n",0);
      fflush(_stderr);
    }
    local_8 = 0xffffffffffffffb8;
  }
  else {
    memset(in_RDI,0,0x50);
    if (1 < g_displayLevel) {
      fprintf(_stderr,"Training on %u samples of total size %u\n",(ulong)nbSamples_00,
              (ulong)pFVar2 & 0xffffffff);
      fflush(_stderr);
    }
    if (1 < g_displayLevel) {
      fprintf(_stderr,"Testing on %u samples of total size %u\n",(ulong)nbSamples_01,
              (ulong)local_80 & 0xffffffff);
      fflush(_stderr);
    }
    *in_RDI = in_RSI;
    in_RDI[2] = in_RDX;
    in_RDI[3] = (ulong)in_ECX;
    in_RDI[4] = (ulong)nbSamples_00;
    in_RDI[5] = (ulong)nbSamples_01;
    if (in_R8D < 9) {
      local_a0 = 8;
    }
    else {
      local_a0 = (ulong)in_R8D;
    }
    in_RDI[6] = (long)pFVar2 + (1 - local_a0);
    *(uint *)(in_RDI + 8) = in_R8D;
    *(undefined4 *)((long)in_RDI + 0x44) = in_R9D;
    in_RDI[9] = in_stack_00000008;
    pvVar3 = calloc((ulong)(in_ECX + 1),8);
    in_RDI[1] = pvVar3;
    if (in_RDI[1] == 0) {
      if (0 < g_displayLevel) {
        fprintf(_stderr,"Failed to allocate scratch buffers \n");
        fflush(_stderr);
      }
      FASTCOVER_ctx_destroy((FASTCOVER_ctx_t *)0x296414);
      local_8 = 0xffffffffffffffc0;
    }
    else {
      *(undefined8 *)in_RDI[1] = 0;
      if (in_ECX < 5) {
        __assert_fail("nbSamples >= 5",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xbdae,
                      "size_t FASTCOVER_ctx_init(FASTCOVER_ctx_t *, const void *, const size_t *, unsigned int, unsigned int, double, unsigned int, FASTCOVER_accel_t)"
                     );
      }
      for (local_64 = 1; local_64 <= in_ECX; local_64 = local_64 + 1) {
        *(size_t *)(in_RDI[1] + (ulong)local_64 * 8) =
             *(long *)(in_RDI[1] + (ulong)(local_64 - 1) * 8) + in_RDX[local_64 - 1];
      }
      pvVar3 = calloc(1L << ((byte)in_R9D & 0x3f),4);
      in_RDI[7] = pvVar3;
      if (in_RDI[7] == 0) {
        if (0 < g_displayLevel) {
          fprintf(_stderr,"Failed to allocate frequency table \n");
          fflush(_stderr);
        }
        FASTCOVER_ctx_destroy((FASTCOVER_ctx_t *)0x29653a);
        local_8 = 0xffffffffffffffc0;
      }
      else {
        if (1 < g_displayLevel) {
          fprintf(_stderr,"Computing frequencies\n");
          fflush(_stderr);
        }
        FASTCOVER_computeFrequency((U32 *)CONCAT44(uVar4,in_stack_ffffffffffffff90),ctx_00);
        local_8 = 0;
      }
    }
  }
  return local_8;
}

Assistant:

static size_t
FASTCOVER_ctx_init(FASTCOVER_ctx_t* ctx,
                   const void* samplesBuffer,
                   const size_t* samplesSizes, unsigned nbSamples,
                   unsigned d, double splitPoint, unsigned f,
                   FASTCOVER_accel_t accelParams)
{
    const BYTE* const samples = (const BYTE*)samplesBuffer;
    const size_t totalSamplesSize = COVER_sum(samplesSizes, nbSamples);
    /* Split samples into testing and training sets */
    const unsigned nbTrainSamples = splitPoint < 1.0 ? (unsigned)((double)nbSamples * splitPoint) : nbSamples;
    const unsigned nbTestSamples = splitPoint < 1.0 ? nbSamples - nbTrainSamples : nbSamples;
    const size_t trainingSamplesSize = splitPoint < 1.0 ? COVER_sum(samplesSizes, nbTrainSamples) : totalSamplesSize;
    const size_t testSamplesSize = splitPoint < 1.0 ? COVER_sum(samplesSizes + nbTrainSamples, nbTestSamples) : totalSamplesSize;

    /* Checks */
    if (totalSamplesSize < MAX(d, sizeof(U64)) ||
        totalSamplesSize >= (size_t)FASTCOVER_MAX_SAMPLES_SIZE) {
        DISPLAYLEVEL(1, "Total samples size is too large (%u MB), maximum size is %u MB\n",
                    (unsigned)(totalSamplesSize >> 20), (FASTCOVER_MAX_SAMPLES_SIZE >> 20));
        return ERROR(srcSize_wrong);
    }

    /* Check if there are at least 5 training samples */
    if (nbTrainSamples < 5) {
        DISPLAYLEVEL(1, "Total number of training samples is %u and is invalid\n", nbTrainSamples);
        return ERROR(srcSize_wrong);
    }

    /* Check if there's testing sample */
    if (nbTestSamples < 1) {
        DISPLAYLEVEL(1, "Total number of testing samples is %u and is invalid.\n", nbTestSamples);
        return ERROR(srcSize_wrong);
    }

    /* Zero the context */
    memset(ctx, 0, sizeof(*ctx));
    DISPLAYLEVEL(2, "Training on %u samples of total size %u\n", nbTrainSamples,
                    (unsigned)trainingSamplesSize);
    DISPLAYLEVEL(2, "Testing on %u samples of total size %u\n", nbTestSamples,
                    (unsigned)testSamplesSize);

    ctx->samples = samples;
    ctx->samplesSizes = samplesSizes;
    ctx->nbSamples = nbSamples;
    ctx->nbTrainSamples = nbTrainSamples;
    ctx->nbTestSamples = nbTestSamples;
    ctx->nbDmers = trainingSamplesSize - MAX(d, sizeof(U64)) + 1;
    ctx->d = d;
    ctx->f = f;
    ctx->accelParams = accelParams;

    /* The offsets of each file */
    ctx->offsets = (size_t*)calloc((nbSamples + 1), sizeof(size_t));
    if (ctx->offsets == NULL) {
        DISPLAYLEVEL(1, "Failed to allocate scratch buffers \n");
        FASTCOVER_ctx_destroy(ctx);
        return ERROR(memory_allocation);
    }

    /* Fill offsets from the samplesSizes */
    {   U32 i;
        ctx->offsets[0] = 0;
        assert(nbSamples >= 5);
        for (i = 1; i <= nbSamples; ++i) {
            ctx->offsets[i] = ctx->offsets[i - 1] + samplesSizes[i - 1];
        }
    }

    /* Initialize frequency array of size 2^f */
    ctx->freqs = (U32*)calloc(((U64)1 << f), sizeof(U32));
    if (ctx->freqs == NULL) {
        DISPLAYLEVEL(1, "Failed to allocate frequency table \n");
        FASTCOVER_ctx_destroy(ctx);
        return ERROR(memory_allocation);
    }

    DISPLAYLEVEL(2, "Computing frequencies\n");
    FASTCOVER_computeFrequency(ctx->freqs, ctx);

    return 0;
}